

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::on_udp_writeable
          (session_impl *this,weak_ptr<libtorrent::aux::session_udp_socket> *sock,error_code *ec)

{
  int iVar1;
  element_type *peVar2;
  pointer psVar3;
  int iVar4;
  pointer psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar6;
  long lVar7;
  bool bVar8;
  
  if (ec->failed_ != false) {
    return;
  }
  this_00 = (sock->super___weak_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar8 = iVar4 == iVar1;
      if (bVar8) {
        this_00->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar8);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = this_00->_M_use_count == 0;
  }
  peVar2 = (sock->super___weak_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if ((bool)(peVar2 == (element_type *)0x0 | bVar8)) goto LAB_002cbe44;
  peVar2->write_blocked = false;
  psVar6 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar3 - (long)psVar6 >> 6;
  psVar5 = psVar6;
  if (0 < lVar7) {
    psVar5 = (pointer)((long)&(psVar6->
                              super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + ((long)psVar3 - (long)psVar6 & 0xffffffffffffffc0U));
    lVar7 = lVar7 + 1;
    psVar6 = psVar6 + 2;
    do {
      if (((psVar6[-2].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + -2;
        goto LAB_002cbe21;
      }
      if (((psVar6[-1].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + -1;
        goto LAB_002cbe21;
      }
      if ((((psVar6->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) goto LAB_002cbe21;
      if (((psVar6[1].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + 1;
        goto LAB_002cbe21;
      }
      lVar7 = lVar7 + -1;
      psVar6 = psVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)psVar3 - (long)psVar5 >> 4;
  if (lVar7 == 1) {
LAB_002cbdfe:
    psVar6 = psVar5;
    if ((((psVar5->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != peVar2) {
      psVar6 = psVar3;
    }
  }
  else if (lVar7 == 2) {
LAB_002cbdee:
    psVar6 = psVar5;
    if ((((psVar5->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != peVar2) {
      psVar5 = psVar5 + 1;
      goto LAB_002cbdfe;
    }
  }
  else {
    psVar6 = psVar3;
    if ((lVar7 == 3) &&
       (psVar6 = psVar5,
       (((psVar5->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->udp_sock).
       super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       peVar2)) {
      psVar5 = psVar5 + 1;
      goto LAB_002cbdee;
    }
  }
LAB_002cbe21:
  if ((psVar6 == psVar3) ||
     (lVar7 = 0x1bf0,
     ((psVar6->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->ssl != ssl)) {
    lVar7 = 0x1a78;
  }
  aux::utp_socket_manager::writable
            ((utp_socket_manager *)
             ((long)&(this->super_session_interface).super_session_logger._vptr_session_logger +
             lVar7));
LAB_002cbe44:
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void session_impl::on_udp_writeable(std::weak_ptr<session_udp_socket> sock, error_code const& ec)
	{
		COMPLETE_ASYNC("session_impl::on_udp_writeable");
		if (ec) return;

		auto s = sock.lock();
		if (!s) return;

		s->write_blocked = false;

#ifdef TORRENT_SSL_PEERS
		auto i = std::find_if(
			m_listen_sockets.begin(), m_listen_sockets.end()
			, [&s] (std::shared_ptr<listen_socket_t> const& ls) { return ls->udp_sock == s; });
#endif

		// notify the utp socket manager it can start sending on the socket again
		struct utp_socket_manager& mgr =
#ifdef TORRENT_SSL_PEERS
			(i != m_listen_sockets.end() && (*i)->ssl == transport::ssl) ? m_ssl_utp_socket_manager :
#endif
			m_utp_socket_manager;

		mgr.writable();
	}